

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsJava.cxx
# Opt level: O2

void __thiscall cmDependsJava::cmDependsJava(cmDependsJava *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  cmDepends::cmDepends(&this->super_cmDepends,(cmLocalGenerator *)0x0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsJava_005d3838;
  return;
}

Assistant:

cmDependsJava::cmDependsJava() = default;